

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Logistics_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Logistics_Header *this)

{
  ostream *poVar1;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Logistics_Header *local_18;
  Logistics_Header *this_local;
  
  local_18 = this;
  this_local = (Logistics_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Receiving Entity ID:\t");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_ReceivingEntity);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tSupplying Entity ID:\t");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_SupplyingEntity);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Logistics_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Receiving Entity ID:	"
       << IndentString( m_ReceivingEntity.GetAsString(), 1 )
       << "\tSupplying Entity ID:	"
       << IndentString( m_SupplyingEntity.GetAsString(), 1 ) ;

    return ss.str();
}